

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O0

void __thiscall
Args::Command::Command<char_const(&)[3]>
          (Command *this,char (*nm) [3],ValueOptions opt,bool isSubCommandRequired)

{
  bool bVar1;
  undefined8 uVar2;
  String *what;
  byte in_CL;
  undefined4 in_EDX;
  long *in_RDI;
  String *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  String *in_stack_fffffffffffffe58;
  BaseException *in_stack_fffffffffffffe60;
  BaseException *this_00;
  undefined6 in_stack_fffffffffffffe80;
  bool in_stack_fffffffffffffe87;
  byte bVar3;
  undefined1 uVar4;
  char (*in_stack_fffffffffffffe88) [3];
  string *this_01;
  GroupIface *in_stack_fffffffffffffe90;
  undefined1 local_141 [33];
  string local_120 [39];
  undefined1 local_f9;
  undefined1 local_f8 [39];
  allocator local_d1;
  string local_d0 [103];
  byte local_69;
  string local_68 [48];
  string local_38 [35];
  byte local_15;
  undefined4 local_14;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  GroupIface::GroupIface<char_const(&)[3]>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe87);
  *in_RDI = (long)&PTR__Command_00184b90;
  *(undefined4 *)((long)in_RDI + 0x4c) = local_14;
  this_01 = (string *)(in_RDI + 10);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string((string *)(in_RDI + 0xe));
  std::__cxx11::string::string((string *)(in_RDI + 0x12));
  *(undefined1 *)(in_RDI + 0x16) = 0;
  *(byte *)((long)in_RDI + 0xb1) = local_15 & 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x147f11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x147f27);
  in_RDI[0x1d] = 0;
  local_69 = 0;
  (**(code **)(*in_RDI + 0x18))(local_38);
  bVar1 = details::isArgument((String *)0x147f5f);
  bVar3 = true;
  if (!bVar1) {
    (**(code **)(*in_RDI + 0x18))(local_68);
    local_69 = 1;
    bVar3 = details::isFlag(in_stack_fffffffffffffe48);
  }
  uVar4 = bVar3;
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_38);
  if ((bVar3 & 1) != 0) {
    local_f9 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d0,
               "Command\'s name can\'t start with \"-\" whereas you are trying to set name to \"",
               &local_d1);
    (**(code **)(*in_RDI + 0x18))(local_f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar4,CONCAT16(bVar3,in_stack_fffffffffffffe80)));
    std::operator+(in_stack_fffffffffffffe58,
                   (char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    BaseException::BaseException(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_f9 = 0;
    __cxa_throw(uVar2,&BaseException::typeinfo,BaseException::~BaseException);
  }
  (**(code **)(*in_RDI + 0x18))(local_120);
  bVar3 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_120);
  if ((bVar3 & 1) != 0) {
    what = (String *)__cxa_allocate_exception(0x30);
    this_00 = (BaseException *)local_141;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_141 + 1),"Command can\'t be with empty name.",(allocator *)this_00);
    BaseException::BaseException(this_00,what);
    __cxa_throw(what,&BaseException::typeinfo,BaseException::~BaseException);
  }
  if (*(int *)((long)in_RDI + 0x4c) == 1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 10),"arg");
  }
  else if (*(int *)((long)in_RDI + 0x4c) == 2) {
    std::__cxx11::string::operator=((string *)(in_RDI + 10),"args");
  }
  return;
}

Assistant:

explicit Command( T && nm,
		ValueOptions opt = ValueOptions::NoValue,
		bool isSubCommandRequired = false )
		:	GroupIface( std::forward< T > ( nm ) )
		,	m_opt( opt )
		,	m_isDefined( false )
		,	m_isSubCommandRequired( isSubCommandRequired )
		,	m_subCommand( nullptr )
	{
		if( details::isArgument( name() ) || details::isFlag( name() ) )
			throw BaseException( String( SL( "Command's name can't "
				"start with \"-\" whereas you are trying to set name to \"" ) ) +
				name() + SL( "\"." ) );

		if( name().empty() )
			throw BaseException(
				String( SL( "Command can't be with empty name." ) ) );

		switch( m_opt )
		{
			case ValueOptions::OneValue :
			{
				m_valueSpecifier = SL( "arg" );
			}
				break;

			case ValueOptions::ManyValues :
			{
				m_valueSpecifier = SL( "args" );
			}
				break;

			default :
				break;
		}
	}